

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int parse_defopcode(SymbolTable *sym,List *new)

{
  char cVar1;
  List *ls_00;
  anon_union_8_7_0ba269be_for_u aVar2;
  long lVar3;
  char *__src;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  void *__s;
  uint *puVar9;
  char *pcVar10;
  void *pvVar11;
  List *pLVar12;
  long lVar13;
  byte bVar14;
  undefined8 uStack_8ac0;
  char *local_8ab8 [2];
  undefined8 local_8aa8;
  ulong local_8aa0;
  List *local_8a98 [2];
  List *isect;
  char *p;
  ListStruct *pLStack_8a78;
  int j;
  List *old_cdr;
  List *saved_amode;
  char intersect [64] [17];
  List *native;
  List *bte;
  char *b;
  int bit;
  int guess;
  char buf [256];
  List *ls;
  int i;
  int max_num_bits_to_expand;
  int num_bits_to_expand [64];
  char *bits_to_expand [64] [64];
  List *code_backup [64];
  int num_variants;
  CCVariant *var;
  List *err;
  List *l;
  ParsedOpcodeInfo info;
  uchar *___tempptr;
  unsigned_long ___newsize;
  List dummy2;
  List dummy1;
  char *name;
  List *new_local;
  SymbolTable *sym_local;
  
  dummy1.token.lineno = 0;
  uStack_8ac0 = 0x1076eb;
  memset(&dummy2.token.lineno,0,0x30);
  uStack_8ac0 = 0x1076fb;
  memset(&___newsize,0,0x30);
  dummy2.cdr = (ListStruct *)&dummy2.token.lineno;
  dummy2.token.u = (anon_union_8_7_0ba269be_for_u)(new->token).filename;
  dummy2.token.filename = (char *)(new->token).lineno;
  dummy2.car = (ListStruct *)CONCAT44((int)((ulong)*(undefined8 *)&new->token >> 0x20),0x4c);
  dummy2.token.type = TOK_FALSE;
  dummy2.token._4_4_ = 0;
  if (((new->token).type == TOK_QUOTED_STRING) || ((new->token).type == TOK_IDENTIFIER)) {
    dummy1.token.lineno = (new->token).u.n;
  }
  dummy2.token.lineno = (unsigned_long)new;
  if (dummy1.token.lineno == 0) {
    uStack_8ac0 = 0x1077ad;
    parse_error(new,"Invalid opcode name.  Ignoring...\n");
    return 0;
  }
  uStack_8ac0 = 0x1077c8;
  reduce((List *)&___newsize,sym,0);
  if (preprocess_only == FALSE) {
    pLVar12 = (dummy2.cdr)->cdr->cdr->car->cdr;
    ls._4_4_ = 0;
    uStack_8ac0 = 0x107803;
    iVar4 = list_length((List *)&dummy2.token.lineno);
    iVar5 = iVar4 + -3;
    uStack_8ac0 = 0x107818;
    iVar6 = list_length(pLVar12);
    if (iVar6 != 4) {
      uStack_8ac0 = 0x107837;
      local_8a98[0] = pLVar12;
      uVar7 = list_length(pLVar12);
      uStack_8ac0 = 0x10784e;
      parse_error(local_8a98[0],"Missing arguments; should be 4, found %d\n",(ulong)uVar7);
      return 0;
    }
    if (0x40 < iVar5) {
      uStack_8ac0 = 0x10787d;
      parse_error(pLVar12,
                  "Error: too many variants.  Only %d allowed.  To raise, change MAX_VARIANTS in defopcode.h.\n"
                  ,0x40);
      return 0;
    }
    uStack_8ac0 = 0x10789c;
    memset(&l,0,0x140);
    l = (List *)((dummy2.cdr)->cdr->token).u.string;
    info.name._0_4_ = (undefined4)(pLVar12->token).u.n;
    info._8_8_ = pLVar12->cdr;
    info.amode = pLVar12->cdr->cdr;
    if (((info.amode)->token).type == TOK_LIST) {
      for (buf._248_8_ = (info.amode)->car; buf._248_8_ != 0;
          buf._248_8_ = *(undefined8 *)buf._248_8_) {
        local_8aa0 = (ulong)(*(int *)(buf._248_8_ + 0x10) - 0x3f);
        switch(local_8aa0) {
        case 0:
          info.cc_variant._0_4_ = 1;
          break;
        case 1:
          info.ends_block = TRUE;
          break;
        case 2:
          info.cc_variant._4_4_ = 1;
          break;
        case 3:
          info.next_block_dynamic = 2;
          break;
        case 4:
          info.next_block_dynamic = 4;
          break;
        case 5:
          info.next_block_dynamic = 4;
          break;
        case 6:
          info.next_block_dynamic = 8;
          break;
        default:
          local_8aa8 = (List *)buf._248_8_;
          uStack_8ac0 = 0x1079d9;
          pcVar10 = unparse_token((Token *)(buf._248_8_ + 0x10),(char *)&bit);
          uStack_8ac0 = 0x1079f1;
          parse_error(local_8aa8,"Unknown misc flag: %s",pcVar10);
        }
      }
    }
    else {
      uStack_8ac0 = 0x107906;
      parse_error(info.amode,"Expecting a list of misc flags!\n");
    }
    info.misc_flags._0_1_ = 0;
    ls_00 = pLVar12->cdr->cdr->cdr;
    if ((pLVar12->cdr->cdr->cdr->token).type == TOK_LIST) {
      for (err = pLVar12->cdr->cdr->cdr->car->cdr; err != (List *)0x0; err = err->cdr) {
        uStack_8ac0 = 0x107ab9;
        strcat((char *)&info.misc_flags,(err->token).u.string);
      }
    }
    else {
      uStack_8ac0 = 0x107a5d;
      parse_error(pLVar12->cdr->cdr->cdr,"Expecting explicit list of opcode bits.\n");
      uStack_8ac0 = 0x107a74;
      strcpy((char *)&info.misc_flags,"0000000000000000");
    }
    uStack_8ac0 = 0x107ade;
    sVar8 = strlen((char *)&info.misc_flags);
    if ((sVar8 & 0xf) != 0) {
      uStack_8ac0 = 0x107afd;
      parse_error(ls_00,"Not a multiple of 16 opcode bits.\n");
      uStack_8ac0 = 0x107b14;
      strcpy((char *)&info.misc_flags,"0000000000000000");
    }
    info.opcode_bits[0x100] = '\0';
    info._289_7_ = 0;
    lVar13 = (long)iVar5 * 0x28;
    lVar3 = -(lVar13 + 0x27U & 0xfffffffffffffff0);
    info._312_8_ = (long)local_8ab8 + lVar3;
    *(long *)info._312_8_ = lVar13 + 0x18;
    *(undefined8 *)((long)local_8ab8 + lVar3 + 8) = 0x940504fe;
    *(undefined1 *)(info._312_8_ + lVar13 + 0x14) = 0xee;
    *(undefined1 *)(info._312_8_ + lVar13 + 0x15) = 0x41;
    *(undefined1 *)(info._312_8_ + lVar13 + 0x16) = 0x51;
    *(undefined1 *)(info._312_8_ + lVar13 + 0x17) = 0x59;
    __s = (void *)((long)&local_8aa8 + lVar3);
    *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107bfc;
    memset(__s,0,(long)iVar5 * 0x28);
    info._288_8_ = __s;
    err = (List *)**(undefined8 **)dummy2.token.lineno;
    for (ls._0_4_ = iVar4 + -4; -1 < (int)ls; ls._0_4_ = (int)ls + -1) {
      if (0 < (int)ls) {
        *(void **)((long)__s + (long)((int)ls + -1) * 0x28 + 0x20) =
             (void *)((long)__s + (long)(int)ls * 0x28);
      }
      bte = (List *)(err->car->cdr->token).u.string;
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107c98;
      sVar8 = strlen((char *)bte);
      if (sVar8 != 5) {
        pLVar12 = err->car->cdr->cdr;
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107cbd;
        parse_error(pLVar12,"Need exactly five characters in cc bits specification.\n");
        bte = (List *)0x11997c;
      }
      for (b._0_4_ = 0; (int)b < 5; b._0_4_ = (int)b + 1) {
        for (b._4_4_ = 0xb; -1 < b._4_4_; b._4_4_ = b._4_4_ + -1) {
          if (parse_defopcode::cc_bit_info[b._4_4_].character ==
              *(char *)((long)&bte->cdr + (long)(4 - (int)b))) {
            bVar14 = (byte)(int)b;
            puVar9 = (uint *)((long)__s + (long)(int)ls * 0x28);
            *puVar9 = *puVar9 & 0xffffffe0 |
                      *puVar9 & 0x1f |
                      (uint)(parse_defopcode::cc_bit_info[b._4_4_].field_0x1 & 1) << (bVar14 & 0x1f)
                      & 0x1f;
            puVar9 = (uint *)((long)__s + (long)(int)ls * 0x28);
            *puVar9 = *puVar9 & 0xfffffc1f |
                      (*puVar9 >> 5 & 0x1f |
                      (uint)((byte)parse_defopcode::cc_bit_info[b._4_4_].field_0x1 >> 1 & 1) <<
                      (bVar14 & 0x1f) & 0x1f) << 5;
            puVar9 = (uint *)((long)__s + (long)(int)ls * 0x28);
            *puVar9 = *puVar9 & 0xfff07fff |
                      (*puVar9 >> 0xf & 0x1f |
                      (uint)((byte)parse_defopcode::cc_bit_info[b._4_4_].field_0x1 >> 2 & 1) <<
                      (bVar14 & 0x1f) & 0x1f) << 0xf;
            puVar9 = (uint *)((long)__s + (long)(int)ls * 0x28);
            *puVar9 = *puVar9 & 0xfe0fffff |
                      (*puVar9 >> 0x14 & 0x1f |
                      (uint)((byte)parse_defopcode::cc_bit_info[b._4_4_].field_0x1 >> 3 & 1) <<
                      (bVar14 & 0x1f) & 0x1f) << 0x14;
            break;
          }
        }
        if (b._4_4_ < 0) {
          pLVar12 = err->car->cdr;
          cVar1 = *(char *)((long)&bte->cdr + (long)(4 - (int)b));
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107ec9;
          parse_error(pLVar12,"Unknown character \'%c\' in cc bit specification.\n",
                      (ulong)(uint)(int)cVar1);
        }
      }
      bte = (List *)(err->car->cdr->cdr->token).u.string;
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107f07;
      sVar8 = strlen((char *)bte);
      if (sVar8 != 5) {
        pLVar12 = err->car->cdr->cdr;
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107f2c;
        parse_error(pLVar12,"Need exactly five characters in cc bits specification.\n");
        bte = (List *)0x11997c;
      }
      for (b._0_4_ = 0; (int)b < 5; b._0_4_ = (int)b + 1) {
        cVar1 = *(char *)((long)&bte->cdr + (long)(4 - (int)b));
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107f76;
        pcVar10 = strchr("-CNVXZ",(int)cVar1);
        if (pcVar10 == (char *)0x0) {
          pLVar12 = err->car->cdr->cdr;
          cVar1 = *(char *)((long)&bte->cdr + (long)(4 - (int)b));
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x107fb4;
          parse_error(pLVar12,
                      "Illegal character \'%c\' in cc bits needed specification.  Must be one of -,C,N,V,X,Z.\n"
                      ,(ulong)(uint)(int)cVar1);
        }
        puVar9 = (uint *)((long)__s + (long)(int)ls * 0x28);
        *puVar9 = *puVar9 & 0xffff83ff |
                  (*puVar9 >> 10 & 0x1f |
                  (uint)(*(char *)((long)&bte->cdr + (long)(4 - (int)b)) != '-') <<
                  ((byte)(int)b & 0x1f) & 0x1f) << 10;
      }
      (&i)[(int)ls] = 0;
      pLVar12 = err->car->cdr->cdr->cdr->car;
      if ((pLVar12->token).type == TOK_EXPLICIT_LIST) {
        for (native = pLVar12->cdr; native != (List *)0x0; native = native->cdr) {
          aVar2 = (native->token).u;
          iVar4 = (&i)[(int)ls];
          (&i)[(int)ls] = iVar4 + 1;
          *(anon_union_8_7_0ba269be_for_u *)
           (bits_to_expand[(long)(int)ls + -1] + (long)iVar4 + 0x3f) = aVar2;
        }
      }
      else {
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x10807a;
        parse_error(pLVar12,"Expecting a list of bit pattern strings.\n");
      }
      iVar4 = (&i)[(int)ls];
      (&i)[(int)ls] = iVar4 + 1;
      bits_to_expand[(long)(int)ls + -1][(long)iVar4 + 0x3f] = "----------------";
      if (ls._4_4_ < (&i)[(int)ls]) {
        ls._4_4_ = (&i)[(int)ls];
      }
      *(ListStruct **)((long)__s + (long)(int)ls * 0x28 + 0x10) = err->car->cdr->cdr->cdr->cdr;
      intersect[0x3f]._9_8_ = err->car->cdr->cdr->cdr->cdr;
      if ((((ListStruct *)intersect[0x3f]._9_8_ == (ListStruct *)0x0) ||
          (((ListStruct *)intersect[0x3f]._9_8_)->car == (ListStruct *)0x0)) ||
         ((((ListStruct *)intersect[0x3f]._9_8_)->car->token).type != TOK_NATIVE_CODE)) {
        *(ListStruct **)((long)__s + (long)(int)ls * 0x28 + 0x10) = err->car->cdr->cdr->cdr->cdr;
      }
      else {
        if ((((ListStruct *)intersect[0x3f]._9_8_)->car->cdr->token).type != TOK_QUOTED_STRING) {
          pLVar12 = ((ListStruct *)intersect[0x3f]._9_8_)->car;
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1081f8;
          parse_error(pLVar12,"Faulty native code specifier.");
        }
        *(undefined8 *)((long)__s + (long)(int)ls * 0x28 + 0x10) =
             *(undefined8 *)intersect[0x3f]._9_8_;
      }
      *(undefined8 *)((long)__s + (long)(int)ls * 0x28 + 0x18) = 0;
      err = err->cdr;
    }
    for (ls._0_4_ = 0; (int)ls < iVar5; ls._0_4_ = (int)ls + 1) {
      pLVar12 = *(List **)((long)__s + (long)(int)ls * 0x28 + 0x10);
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1082d0;
      verify_fields_exist((char *)&info.misc_flags,pLVar12);
    }
    for (ls._0_4_ = 0; (int)ls < iVar5; ls._0_4_ = (int)ls + 1) {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x108303;
      pvVar11 = malloc(0x11);
      *(void **)((long)__s + (long)(int)ls * 0x28 + 8) = pvVar11;
      code_backup[(long)(int)ls + -1] = *(List **)((long)__s + (long)(int)ls * 0x28 + 0x10);
    }
    for (ls._0_4_ = 0; (int)ls < ls._4_4_; ls._0_4_ = (int)ls + 1) {
      old_cdr = (List *)info._8_8_;
      pLStack_8a78 = *(ListStruct **)info._8_8_;
      *(undefined8 *)info._8_8_ = 0;
      for (p._4_4_ = 0; p._4_4_ < iVar5; p._4_4_ = p._4_4_ + 1) {
        pLVar12 = code_backup[(long)p._4_4_ + -1];
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1083cd;
        pLVar12 = copy_list(pLVar12);
        *(List **)((long)__s + (long)p._4_4_ * 0x28 + 0x10) = pLVar12;
      }
      for (p._4_4_ = 0; p._4_4_ < iVar5; p._4_4_ = p._4_4_ + 1) {
        pcVar10 = *(char **)((long)__s + (long)p._4_4_ * 0x28 + 8);
        local_8ab8[1] = pcVar10;
        if ((int)ls < (&i)[p._4_4_]) {
          local_8ab8[0] = bits_to_expand[(long)p._4_4_ + -1][(long)(int)ls + 0x3f];
        }
        else {
          local_8ab8[0] = "----------------";
        }
        __src = local_8ab8[0];
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x108498;
        strcpy(pcVar10,__src);
        lVar13 = (long)p._4_4_;
        pcVar10 = *(char **)((long)__s + (long)p._4_4_ * 0x28 + 8);
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1084cb;
        strcpy(intersect[lVar13 + -1] + 9,pcVar10);
        for (isect = (List *)(intersect[(long)p._4_4_ + -1] + 9); *(char *)&isect->cdr != '\0';
            isect = (List *)((long)&isect->cdr + 1)) {
          if (*(char *)&isect->cdr == '-') {
            *(undefined1 *)&isect->cdr = 0x78;
          }
        }
        for (isect = *(List **)((long)__s + (long)p._4_4_ * 0x28 + 8); *(char *)&isect->cdr != '\0';
            isect = (List *)((long)&isect->cdr + 1)) {
          if ((*(char *)&isect->cdr == '0') || (*(char *)&isect->cdr == '1')) {
            *(undefined1 *)&isect->cdr = 0x78;
          }
        }
      }
      for (p._4_4_ = 0; p._4_4_ < iVar5; p._4_4_ = p._4_4_ + 1) {
        lVar13 = (long)p._4_4_;
        *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1085e5;
        iVar4 = strcmp(intersect[lVar13 + -1] + 9,"xxxxxxxxxxxxxxxx");
        if (iVar4 != 0) {
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1085f3;
          local_8a98[1] = alloc_list();
          (local_8a98[1]->token).type = TOK_LIST;
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x10860d;
          pLVar12 = alloc_list();
          local_8a98[1]->car = pLVar12;
          (local_8a98[1]->car->token).type = TOK_INTERSECT;
          (local_8a98[1]->car->token).u.string = "intersect";
          *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x108648;
          pLVar12 = alloc_list();
          local_8a98[1]->car->cdr = pLVar12;
          (local_8a98[1]->car->cdr->token).type = TOK_QUOTED_STRING;
          (local_8a98[1]->car->cdr->token).u.string = intersect[(long)p._4_4_ + -1] + 9;
          local_8a98[1]->car->cdr->cdr = (ListStruct *)info._8_8_;
          info._8_8_ = local_8a98[1];
        }
      }
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1086e1;
      generate_opcode((ParsedOpcodeInfo *)&l,sym);
      info._8_8_ = old_cdr;
      old_cdr->cdr = pLStack_8a78;
    }
    info._312_8_ = (long)local_8ab8 + lVar3;
    if (*(long *)((long)local_8ab8 + lVar3 + 8) != 0x940504fe) {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x108769;
      __assert_fail("((long *)___tempptr)[1] == FIREWALL_START",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                    ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
    }
    lVar13 = *(long *)info._312_8_;
    if (*(char *)(info._312_8_ + lVar13 + -4) != -0x12) {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1087b8;
      __assert_fail("___tempptr[___newsize-4] == FIREWALL_STOP_0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                    ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
    }
    if (*(char *)(info._312_8_ + lVar13 + -3) != 'A') {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x1087f4;
      __assert_fail("___tempptr[___newsize-3] == FIREWALL_STOP_1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                    ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
    }
    if (*(char *)(info._312_8_ + lVar13 + -2) != 'Q') {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x108830;
      __assert_fail("___tempptr[___newsize-2] == FIREWALL_STOP_2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                    ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
    }
    if (*(char *)(info._312_8_ + lVar13 + -1) != 'Y') {
      *(undefined8 *)((long)&uStack_8ac0 + lVar3) = 0x10886c;
      __assert_fail("___tempptr[___newsize-1] == FIREWALL_STOP_3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                    ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
    }
  }
  return 1;
}

Assistant:

static int
parse_defopcode (SymbolTable *sym, List *new)
{
  const char *name = NULL;
  List dummy1 = { /* new */ 0, NULL, { /* new->token */ 0 } };
  List dummy2 = { NULL, /* &dummy1 */ 0, { /* new->token */ 0 } };
  SAFE_DECL ();

  dummy1.cdr = new;
  dummy1.token = new->token;
  dummy2.car = &dummy1;
  dummy2.token = new->token;

  dummy1.token.type = TOK_DEFOPCODE;
  dummy1.token.u.string = "defopcode";
  dummy2.token.type = TOK_LIST;
  dummy2.token.u.string = NULL;

  if (new->token.type == TOK_QUOTED_STRING
      || new->token.type == TOK_IDENTIFIER)
    name = new->token.u.string;

  /* Make sure the opcode name is legitimate. */
  if (name == NULL)
    {
      parse_error (new, "Invalid opcode name.  Ignoring...\n");
      return 0;
    }

  /* Perform initial macro substitutions. */
  reduce (&dummy2, sym, 0);

  /* Generate the opcode. */
  if (!preprocess_only)
    {
      ParsedOpcodeInfo info;
      List *l = CDR (CADDAR (&dummy2)), *err;
      CCVariant *var;
      int num_variants;
      List *code_backup[MAX_VARIANTS];
      const char *bits_to_expand[MAX_VARIANTS][MAX_VARIANTS];
      int num_bits_to_expand[MAX_VARIANTS];
      int max_num_bits_to_expand = 0;
      int i;

      num_variants = list_length (&dummy1) - 3;
      if (list_length (l) != 4)
	{
	  parse_error (l, "Missing arguments; should be 4, found %d\n",
		       list_length (l));
	  return 0;
	}

      if (num_variants > MAX_VARIANTS)
	{
	  parse_error (l, "Error: too many variants.  Only %d allowed.  To "
		       "raise, change MAX_VARIANTS in defopcode.h.\n",
		       MAX_VARIANTS);
	  return 0;
	}

      /* Parse in the instruction information. */
      memset (&info, 0, sizeof info);
      info.name = CDAR (&dummy2)->token.u.string;
      info.cpu = l->token.u.n;
      info.amode = CDR (l);
      info.misc_flags = CDDR (l);

      if (info.misc_flags->token.type != TOK_LIST)
	parse_error (info.misc_flags, "Expecting a list of misc flags!\n");
      else
	{
	  List *ls;
	  for (ls = info.misc_flags->car; ls != NULL; ls = ls->cdr)
	    {
	      char buf[256];

	      switch (ls->token.type) {
	      case TOK_ENDS_BLOCK:
		info.ends_block = TRUE;
		break;
	      case TOK_DONT_POSTINCDEC_UNEXPANDED:
		info.dont_postincdec_unexpanded = TRUE;
		break;
	      case TOK_NEXT_BLOCK_DYNAMIC:
		info.next_block_dynamic = TRUE;
		break;
	      case TOK_SKIP_TWO_OPERAND_WORDS:
		info.operand_words_to_skip = 2;
		break;
	      case TOK_SKIP_FOUR_OPERAND_WORDS:
		info.operand_words_to_skip = 4;
		break;
	      case TOK_SKIP_ONE_POINTER:
	        info.operand_words_to_skip = PTR_WORDS;
	        break;
	      case TOK_SKIP_TWO_POINTERS:
	        info.operand_words_to_skip = PTR_WORDS * 2;
	        break;
	      default:
		parse_error (ls, "Unknown misc flag: %s",
			     unparse_token (&ls->token, buf));
		break;
	      }
	    }
	}

      info.opcode_bits[0] = '\0';
      err = CDDDR (l);  /* For later, in case we need it. */
      if (CDDDR (l)->token.type != TOK_LIST)
	{
	  parse_error (CDDDR (l), "Expecting explicit list of opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      else
	for (l = CDR (CADDDR (l)); l != NULL; l = l->cdr)
	  {
	    if (0 && strlen (l->token.u.string) != 16)
	      {
		/* This seems a little harsh... */
		parse_error (l, "Need exactly 16 characters in each bit "
			     "pattern specification string, found %d.\n",
			     strlen (l->token.u.string));
		strcat (info.opcode_bits, "0000000000000000");
	      }
	    else
	      strcat (info.opcode_bits, l->token.u.string);
	  }
      if (strlen (info.opcode_bits) % 16)
	{
	  parse_error (err, "Not a multiple of 16 opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      info.cc_variant = NULL;

      /* Parse the information for the cc variants. */
      var = (CCVariant *) SAFE_alloca (num_variants * sizeof (CCVariant));
      memset (var, 0, num_variants * sizeof (CCVariant));
      info.cc_variant = var;

      /* Loop through and parse each cc variant. */
      for (i = num_variants - 1, l = CDDDR (&dummy1); i >= 0; i--, l = l->cdr)
	{
	  static const struct {
	    char character;
	    unsigned char cc_may_set:1;
	    unsigned char cc_may_not_set:1;
	    unsigned char cc_to_known_value:1;
	    unsigned char cc_known_values:1;
	  } cc_bit_info[] = {
	    { '0', 1, 0, 1, 0 },    /* 0  ->  always force cc bit to 0.    */
	    { '1', 1, 0, 1, 1 },    /* 1  ->  always force cc bit to 1.    */
	    { 'C', 1, 0, 0, 0 },    /* Any letter means will always set    */
	    { 'N', 1, 0, 0, 0 },    /*     cc bit to either 0 or 1, but    */
	    { 'V', 1, 0, 0, 0 },    /*     we can't determine which at     */
	    { 'X', 1, 0, 0, 0 },    /*     compile time.                   */
	    { 'Z', 1, 0, 0, 0 },    /*                                     */
	    { '-', 0, 1, 0, 0 },    /* -  ->  cc bit always unchanged.     */
	    { '>', 1, 1, 0, 0 },    /* >  ->  cc set to 1 or unchanged.    */
	    { '<', 1, 1, 0, 0 },    /* <  ->  cc set to 0 or unchanged.    */
	    { '?', 1, 0, 0, 0 },    /* ?  ->  cc bit undefined.            */
	    { '%', 1, 1, 0, 0 },    /* %  ->  cc might change, might not.  */
	  };
	  int guess, bit;
	  const char *b;
	  List *bte;
	  
	  /* Insert them in reverse order. */
	  if (i > 0)
	    var[i - 1].next = &var[i];

	  /* Parse the cc bits set specs. */
	  b = (CDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
			 
	  for (bit = 0; bit < 5; bit++)
	    {
	      for (guess = sizeof cc_bit_info / sizeof cc_bit_info[0] - 1;
		   guess >= 0; guess--)
		if (cc_bit_info[guess].character == b[4 - bit])
		  {
		    var[i].cc_may_set |= cc_bit_info[guess].cc_may_set << bit;
		    var[i].cc_may_not_set
		      |= cc_bit_info[guess].cc_may_not_set << bit;
		    var[i].cc_to_known_value
		      |= cc_bit_info[guess].cc_to_known_value << bit;
		    var[i].cc_known_values
		      |= cc_bit_info[guess].cc_known_values << bit;
		    break;
		  }
	      if (guess < 0)
		parse_error (CDAR (l), "Unknown character '%c' in cc bit "
			     "specification.\n", b[4 - bit]);
	    }

	  /* Parse the cc bits needed specs. */
	  b = (CDDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
	  
	  for (bit = 0; bit < 5; bit++)
	    {
	      if (strchr ("-CNVXZ", b[4 - bit]) == NULL)
		parse_error (CDDAR (l), "Illegal character '%c' in cc bits "
			     "needed specification.  Must be one of "
			     "-,C,N,V,X,Z.\n",
			     b[4 - bit]);
	      var[i].cc_needed |= (b[4 - bit] != '-') << bit;
	    }


	  /* Fetch all of the bits_to_expand strings into an array.
	   * Terminate the list provided by the user with "----------------"
	   * so we guarantee that all legal bit patterns get code generated
	   * for them.
	   */
	  num_bits_to_expand[i] = 0;
	  bte = CADDR (CDAR (l));
	  if (bte->token.type != TOK_EXPLICIT_LIST)
	    parse_error (bte, "Expecting a list of bit pattern strings.\n");
	  else
	    {
	      for (bte = bte->cdr; bte != NULL; bte = bte->cdr)
		bits_to_expand[i][num_bits_to_expand[i]++]
		  = bte->token.u.string;
	    }
	  bits_to_expand[i][num_bits_to_expand[i]++]
	    = "----------------";
	  if (num_bits_to_expand[i] > max_num_bits_to_expand)
	    max_num_bits_to_expand = num_bits_to_expand[i];
	  var[i].code = CDDR (CDDAR (l));

	  {
	    List *native = CDDR (CDDAR (l));
	    if (native != NULL && CAR (native) != NULL
		&& (CAR (native))->token.type == TOK_NATIVE_CODE)
	      {
		if ((CDAR (native))->token.type != TOK_QUOTED_STRING)
		  parse_error (CAR (native), "Faulty native code specifier.");
#ifdef GENERATE_NATIVE_CODE

		{
		  char buf[1024];
		  List *xx;

		  buf[0] = '\0';
		  for (xx = CDAR (native); xx != NULL; xx = xx->cdr)
		    {
		      if (xx->token.type == TOK_QUOTED_STRING)
			strcat (buf, xx->token.u.string);
		      else
			parse_error (xx, "Expected string here.");
		    }
		  if (buf[0] == '\0' || !strcmp (buf, "none"))
		    var[i].native_code_info = NULL;
		  else
		    var[i].native_code_info = unique_string (buf);
		}
#endif
		var[i].code = native->cdr;
	      }
	    else
	      {
#ifdef GENERATE_NATIVE_CODE
		var[i].native_code_info = NULL;
#endif
		var[i].code = CDDR (CDDAR (l));
	      }
	  }

#ifndef GENERATE_NATIVE_CODE
	  var[i].native_code_info = NULL;
#endif
	}

      /* Verify that all of the fields they specified actually exist. */
      for (i = 0; i < num_variants; i++)
	verify_fields_exist (info.opcode_bits, var[i].code);

      /* Loop through and generate code for each bits_to_expand specified.
       * This is not elegant; originally, only one bits_to_expand string
       * could be specified, and its semantics were more limited than the
       * new, more powerful versions.  To compensate, we will call the
       * lower level routines once for each bits_to_expand string, and
       * modify the legal addressing mode expression to provide us with the
       * new literal bits matching capability of the new bits_to_expand
       * strings.
       */
      
      for (i = 0; i < num_variants; i++)
	{
/*
 * TODO:  FIXME -- I don't like "17" below
 */
	  /* We allocate 17 bytes because we can only expand up to 16
	   * bits, and we have one extra for the terminating 0.
	   */
	  var[i].bits_to_expand = (char *) malloc (17);
	  code_backup[i] = var[i].code;
	}

      for (i = 0; i < max_num_bits_to_expand; i++)
	{
	  char intersect[MAX_VARIANTS][17];
	  List *saved_amode = info.amode;
	  List *old_cdr = info.amode->cdr;
	  int j;
	  
	  info.amode->cdr = NULL;

	  /* Preserve code. */
	  for (j = 0; j < num_variants; j++)
	    var[j].code = copy_list (code_backup[j]);

	  /* Grab all of the bits_to_expand strings. */
	  for (j = 0; j < num_variants; j++)
	    {
	      char *p;
	      strcpy (var[j].bits_to_expand, ((i < num_bits_to_expand[j])
					      ? bits_to_expand[j][i]
					      : "----------------"));
	      
	      /* Generate the intersection string. */
	      strcpy (intersect[j], var[j].bits_to_expand);
	      for (p = intersect[j]; *p != '\0'; p++)
		if (*p == '-')
		  *p = 'x';
	      
	      /* Expand all literal bits by replacing them with 'x'.*/
	      for (p = var[j].bits_to_expand; *p != '\0'; p++)
		if (*p == '0' || *p == '1')
		  *p = 'x';
	    }
	  
	  /* Intersect with all of the literal bits we know about. */
	  for (j = 0; j < num_variants; j++)
	    if (strcmp (intersect[j], "xxxxxxxxxxxxxxxx"))
	      {
		List *isect = alloc_list ();
		isect->token.type = TOK_LIST;
		isect->car = alloc_list ();
		isect->car->token.type = TOK_INTERSECT;
		isect->car->token.u.string = "intersect";
		isect->car->cdr = alloc_list ();
		isect->car->cdr->token.type = TOK_QUOTED_STRING;
		isect->car->cdr->token.u.string = intersect[j];
		isect->car->cdr->cdr = info.amode;
		info.amode = isect;
	      }

	  /* Generate the actual code. */
	  generate_opcode (&info, sym);

	  /* Memory leak here, but who cares? */
	  info.amode = saved_amode;
	  info.amode->cdr = old_cdr;
	}
	ASSERT_SAFE(var);
    }

  return 1;
}